

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable.c
# Opt level: O2

void ares_htable_buckets_destroy(ares_llist_t **buckets,uint size,ares_bool_t destroy_vals)

{
  ares_llist_t *list;
  ulong uVar1;
  
  if (buckets != (ares_llist_t **)0x0) {
    for (uVar1 = 0; size != uVar1; uVar1 = uVar1 + 1) {
      list = buckets[uVar1];
      if (list != (ares_llist_t *)0x0) {
        if (destroy_vals == ARES_FALSE) {
          ares_llist_replace_destructor(list,(ares_llist_destructor_t)0x0);
          list = buckets[uVar1];
        }
        ares_llist_destroy(list);
      }
    }
    ares_free(buckets);
    return;
  }
  return;
}

Assistant:

static void ares_htable_buckets_destroy(ares_llist_t **buckets,
                                        unsigned int   size,
                                        ares_bool_t    destroy_vals)
{
  unsigned int i;

  if (buckets == NULL) {
    return;
  }

  for (i = 0; i < size; i++) {
    if (buckets[i] == NULL) {
      continue;
    }

    if (!destroy_vals) {
      ares_llist_replace_destructor(buckets[i], NULL);
    }

    ares_llist_destroy(buckets[i]);
  }

  ares_free(buckets);
}